

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O0

char * cinatra::detail::parse_headers
                 (char *buf,char *buf_end,http_header *headers,size_t *num_headers,
                 size_t max_headers,int *ret,bool *has_connection,bool *has_close,bool *has_upgrade)

{
  int iVar1;
  size_t *psVar2;
  long *in_RCX;
  long in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_R8;
  int *in_R9;
  undefined1 *in_stack_00000008;
  undefined1 *in_stack_00000010;
  undefined1 *in_stack_00000018;
  char ch;
  int found;
  size_t value_len;
  char *value;
  size_t name_len;
  char *name;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  char local_5d;
  int local_5c;
  size_type local_58;
  char *local_50;
  size_type local_48;
  byte *local_40;
  int *local_38;
  long local_30;
  long *local_28;
  long local_20;
  byte *local_18;
  byte *local_10;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_10 == local_18) {
      *local_38 = -2;
      return (char *)0x0;
    }
    if (*local_10 == 0xd) {
      if (local_10 + 1 == local_18) {
        *local_38 = -2;
        return (char *)0x0;
      }
      if (local_10[1] == 10) {
        return (char *)(local_10 + 2);
      }
      *local_38 = -1;
      return (char *)0x0;
    }
    if (*local_10 == 10) {
      return (char *)(local_10 + 1);
    }
    if (*local_28 == local_30) break;
    if ((*local_28 == 0) || ((*local_10 != 0x20 && (*local_10 != 9)))) {
      local_40 = local_10;
      local_10 = (byte *)findchar_fast((char *)local_10,(char *)local_18,"",0x10,&local_5c);
      if ((local_5c == 0) && (local_10 == local_18)) {
        *local_38 = -2;
        return (char *)0x0;
      }
      while (*local_10 != 0x3a) {
        if (token_char_map[*local_10] == '\0') {
          *local_38 = -1;
          return (char *)0x0;
        }
        local_10 = local_10 + 1;
        if (local_10 == local_18) {
          *local_38 = -2;
          return (char *)0x0;
        }
      }
      local_48 = (long)local_10 - (long)local_40;
      if (local_48 == 0) {
        *local_38 = -1;
        return (char *)0x0;
      }
      do {
        local_10 = local_10 + 1;
        if (local_10 == local_18) {
          *local_38 = -2;
          return (char *)0x0;
        }
      } while ((*local_10 == 0x20) || (*local_10 == 9));
    }
    else {
      local_40 = (byte *)0x0;
      local_48 = 0;
    }
    local_10 = (byte *)get_token_to_eol((char *)local_10,(char *)local_18,&local_50,&local_58,
                                        local_38);
    if (local_10 == (byte *)0x0) {
      return (char *)0x0;
    }
    if ((local_48 == 10) && (iVar1 = memcmp(local_40 + 1,"onnection",9), iVar1 == 0)) {
      *in_stack_00000008 = 1;
      local_5d = *local_50;
      if ((local_5d == 'U') || (local_5d == 'u')) {
        *in_stack_00000018 = 1;
      }
      else if ((local_5d == 'c') || (local_5d == 'C')) {
        *in_stack_00000010 = 1;
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,(char *)local_40,local_48);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,local_50,local_58);
    psVar2 = (size_t *)(local_20 + *local_28 * 0x20);
    *psVar2 = local_80._M_len;
    psVar2[1] = (size_t)local_80._M_str;
    psVar2[2] = local_70._M_len;
    psVar2[3] = (size_t)local_70._M_str;
    *local_28 = *local_28 + 1;
  }
  *local_38 = -1;
  return (char *)0x0;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end,
                                 http_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret,
                                 bool &has_connection, bool &has_close,
                                 bool &has_upgrade) {
  for (;; ++*num_headers) {
    const char *name;
    size_t name_len;
    const char *value;
    size_t value_len;
    CHECK_EOF();
    if (*buf == '\015') {
      ++buf;
      EXPECT_CHAR('\012');
      break;
    }
    else if (*buf == '\012') {
      ++buf;
      break;
    }
    if (*num_headers == max_headers) {
      *ret = -1;
      return NULL;
    }
    if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
      /* parsing name, but do not discard SP before colon, see
       * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
      name = buf;
      static const char ALIGNED(16) ranges1[] =
          "\x00 "  /* control chars and up to SP */
          "\"\""   /* 0x22 */
          "()"     /* 0x28,0x29 */
          ",,"     /* 0x2c */
          "//"     /* 0x2f */
          ":@"     /* 0x3a-0x40 */
          "[]"     /* 0x5b-0x5d */
          "{\377"; /* 0x7b-0xff */
      int found;
      buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
      if (!found) {
        CHECK_EOF();
      }
      while (1) {
        if (*buf == ':') {
          break;
        }
        else if (!token_char_map[(unsigned char)*buf]) {
          *ret = -1;
          return NULL;
        }
        ++buf;
        CHECK_EOF();
      }
      if ((name_len = buf - name) == 0) {
        *ret = -1;
        return NULL;
      }
      ++buf;
      for (;; ++buf) {
        CHECK_EOF();
        if (!(*buf == ' ' || *buf == '\t')) {
          break;
        }
      }
    }
    else {
      name = NULL;
      name_len = 0;
    }
    if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) ==
        NULL) {
      return NULL;
    }
    if (name_len == 10) {
      if (memcmp(name + 1, "onnection", name_len - 1) == 0) {
        // has connection
        has_connection = true;
        char ch = *value;
        if (ch == 'U' || ch == 'u') {
          // has upgrade
          has_upgrade = true;
        }
        else if (ch == 'c' || ch == 'C') {
          // has_close
          has_close = true;
        }
      }
    }
    headers[*num_headers] = {std::string_view{name, name_len},
                             std::string_view{value, value_len}};
  }
  return buf;
}